

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O3

void laplacian(qnode_ptr_t p)

{
  int iVar1;
  uint uVar2;
  image512_t *pafVar3;
  image512_t *pafVar4;
  qnode_ptr_t p_00;
  int iVar5;
  uint uVar6;
  kernel_t *pkVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  undefined8 auStack_828 [258];
  
  bVar11 = 0;
  iVar1 = p->sizy;
  p_00 = (qnode_ptr_t)malloc(0x40);
  iVar5 = p->sizx;
  p_00->res = p->res;
  p_00->sizx = iVar5;
  p_00->sizy = iVar1;
  p_00->level = 0;
  alloc_lap(p_00);
  pafVar3 = p->lap_ptr;
  p_00->gauss_ptr = pafVar3;
  uVar2 = p_00->sizy;
  if (0 < (int)uVar2) {
    iVar1 = p_00->sizx;
    uVar6 = 0;
    do {
      if (0 < iVar1) {
        lVar10 = 0;
        do {
          if ((uVar6 & 1 & (uint)lVar10) == 0) {
            (*pafVar3)[(long)p_00->res * (long)(int)uVar6 + lVar10] = 0.0;
          }
          lVar10 = lVar10 + 1;
        } while (iVar1 != (int)lVar10);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  pkVar7 = &kerb;
  puVar8 = auStack_828;
  for (lVar10 = 0x101; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar8 = *(undefined8 *)pkVar7->k;
    pkVar7 = (kernel_t *)((long)pkVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
  }
  convolve(p_00);
  p->lap_ptr = p_00->lap_ptr;
  dealloc_gauss(p_00);
  free(p_00);
  iVar1 = p->sizy;
  if (0 < iVar1) {
    uVar2 = p->sizx;
    iVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar10 = (long)iVar5 * (long)p->res;
        pafVar3 = p->gauss_ptr;
        pafVar4 = p->lap_ptr;
        uVar9 = 0;
        do {
          (*pafVar4)[lVar10 + uVar9] = (*pafVar3)[lVar10 + uVar9] - (*pafVar4)[lVar10 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar1);
  }
  return;
}

Assistant:

void laplacian(p)
qnode_ptr_t p ;

{ extern kernel_t kerb ;
  qnode_ptr_t create_node(), q ;
  int i, j ;

  q = create_node(0,p->res,p->sizx,p->sizy) ;
  alloc_lap(q) ;
  q->gauss_ptr = p->lap_ptr ;
  for (i = 0 ; i < q->sizy ; i++) {
    for (j = 0 ; j < q->sizx ; j++) {
      if ((i%2 == 0) || (j%2 == 0)) {
        (*q->gauss_ptr)[q->res*i + j] = 0.0 ;
      }
    }
  }
  convolve(q,kerb) ;
  p->lap_ptr = q->lap_ptr ;
  dealloc_gauss(q) ;
  free(q) ;
  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      (*p->lap_ptr)[p->res*i + j] =
      (*p->gauss_ptr)[p->res*i + j] - (*p->lap_ptr)[p->res*i + j] ;
    }
  }
}